

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

void __thiscall
discordpp::field<discordpp::InstallParams>::field
          (field<discordpp::InstallParams> *this,field<discordpp::InstallParams> *f)

{
  bool bVar1;
  field<discordpp::InstallParams> *f_local;
  field<discordpp::InstallParams> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)f);
  if (bVar1) {
    std::unique_ptr<discordpp::InstallParams,_std::default_delete<discordpp::InstallParams>_>::
    operator*(&f->t_);
    std::make_unique<discordpp::InstallParams,discordpp::InstallParams&>((InstallParams *)this);
  }
  else {
    std::unique_ptr<discordpp::InstallParams,std::default_delete<discordpp::InstallParams>>::
    unique_ptr<std::default_delete<discordpp::InstallParams>,void>
              ((unique_ptr<discordpp::InstallParams,std::default_delete<discordpp::InstallParams>> *
               )this,(nullptr_t)0x0);
  }
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}